

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdBot.cpp
# Opt level: O0

void setupSignalHandler(void)

{
  const_iterator piVar1;
  int sig;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<int> *__range1;
  thread *in_stack_ffffffffffffffa8;
  initializer_list<int> *in_stack_ffffffffffffffb0;
  int *local_38;
  int local_2c;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  initializer_list<int> local_18;
  initializer_list<int> *local_8;
  
  std::mutex::lock((mutex *)in_stack_ffffffffffffffb0);
  local_2c = 6;
  uVar2 = 8;
  uVar3 = 2;
  uVar4 = 0xb;
  uVar5 = 0xf;
  local_18._M_array = &local_2c;
  local_18._M_len = 5;
  local_8 = &local_18;
  local_38 = std::initializer_list<int>::begin(local_8);
  piVar1 = std::initializer_list<int>::end(in_stack_ffffffffffffffb0);
  for (; local_38 != piVar1; local_38 = local_38 + 1) {
    signal(*local_38,signalHandler);
  }
  std::thread::thread<setupSignalHandler()::__0,,void>
            ((thread *)CONCAT44(uVar5,uVar4),(type *)CONCAT44(uVar3,uVar2));
  std::thread::operator=((thread *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::thread::~thread((thread *)0x11453e);
  return;
}

Assistant:

void setupSignalHandler() {
    signalMutex.lock();

    for (auto sig : { SIGABRT, SIGFPE, SIGINT, SIGSEGV, SIGTERM }) {
        std::signal(sig, signalHandler);
    }

    signalThread = std::thread([&]() {
        std::unique_lock<std::mutex> lock(signalMutex);
        spdlog::critical("Received signal: {}", receivedSignal);
        spdlog::shutdown();
        std::exit(-1);
    });
}